

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::applyParams
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandedDecl *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Reader subSource)

{
  BrandScope *pBVar1;
  undefined1 auVar2 [8];
  BrandScope *pBVar3;
  BrandedDecl *pBVar4;
  Disposer *pDVar5;
  undefined1 local_f8 [8];
  BrandScope *local_f0;
  BrandedDecl *local_e8;
  Disposer *pDStack_e0;
  BrandScope *local_d8;
  BrandedDecl local_d0;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pBVar1 = (this->brand).ptr;
    local_e8 = params->ptr;
    pDStack_e0 = (Disposer *)params->size_;
    local_d8 = (BrandScope *)params->disposer;
    params->ptr = (BrandedDecl *)0x0;
    params->size_ = 0;
    BrandScope::setParams
              ((BrandScope *)local_f8,(Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar1,
               (Which)&local_e8,subSource);
    if (local_f0 == (BrandScope *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandedDecl(&local_d0,this);
      pBVar3 = local_d0.brand.ptr;
      pDVar5 = local_d0.brand.disposer;
      pBVar1 = local_f0;
      auVar2 = local_f8;
      local_d0.brand.disposer = (Disposer *)local_f8;
      local_d0.brand.ptr = local_f0;
      local_f0 = (BrandScope *)0x0;
      if (pBVar3 != (BrandScope *)0x0) {
        (**pDVar5->_vptr_Disposer)
                  (pDVar5,(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                          (long)&(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer);
      }
      pBVar3 = local_f0;
      local_d0.source._reader.segment = subSource._reader.segment;
      local_d0.source._reader.capTable = subSource._reader.capTable;
      local_d0.source._reader.data = subSource._reader.data;
      local_d0.source._reader.pointers = subSource._reader.pointers;
      local_d0.source._reader._32_8_ = subSource._reader._32_8_;
      local_d0.source._reader._40_8_ = subSource._reader._40_8_;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_d0.body.tag;
      if (local_d0.body.tag == 2) {
        *(void **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_d0.body.field_1.forceAligned;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_d0.body.field_1._8_8_;
      }
      else if (local_d0.body.tag == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             local_d0.body.field_1._32_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             local_d0.body.field_1._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_d0.body.field_1._24_8_;
        *(void **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_d0.body.field_1.forceAligned;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_d0.body.field_1._8_8_;
        *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
             local_d0.body.field_1.space[0x28];
        if (local_d0.body.field_1.space[0x28] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
               local_d0.body.field_1._80_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
               local_d0.body.field_1._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
               local_d0.body.field_1._64_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
               local_d0.body.field_1._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               local_d0.body.field_1._48_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
               local_d0.body.field_1._56_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)auVar2;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar1;
      *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) =
           subSource._reader.dataSize;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) =
           subSource._reader._36_4_;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = subSource._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) =
           subSource._reader._44_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) =
           subSource._reader.data._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) =
           subSource._reader.data._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) =
           subSource._reader.pointers._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) =
           subSource._reader.pointers._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) =
           subSource._reader.segment._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
           subSource._reader.segment._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) =
           subSource._reader.capTable._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
           subSource._reader.capTable._4_4_;
      if (local_f0 != (BrandScope *)0x0) {
        local_f0 = (BrandScope *)0x0;
        (***(_func_int ***)local_f8)
                  (local_f8,(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                            (long)&(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer);
      }
    }
    pDVar5 = pDStack_e0;
    pBVar4 = local_e8;
    if (local_e8 != (BrandedDecl *)0x0) {
      local_e8 = (BrandedDecl *)0x0;
      pDStack_e0 = (Disposer *)0x0;
      (**(local_d8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_d8,pBVar4,0xa8,pDVar5,pDVar5,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::
                 destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return nullptr;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}